

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::append<std::move_iterator<unsigned_char*>,void>
          (SmallVectorImpl<unsigned_char> *this,move_iterator<unsigned_char_*> in_start,
          move_iterator<unsigned_char_*> in_end)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  SmallVectorImpl<unsigned_char> *this_local;
  move_iterator<unsigned_char_*> in_end_local;
  move_iterator<unsigned_char_*> in_start_local;
  
  uVar2 = std::distance<std::move_iterator<unsigned_char*>>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<unsigned_char,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_char,_true>,sVar3 + uVar2);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<unsigned_char,true>::
  uninitialized_copy<std::move_iterator<unsigned_char*>,unsigned_char*>
            (in_start,in_end,(uchar *)((long)pvVar1 + sVar3));
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }